

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osMutex.cpp
# Opt level: O3

void osMutex::dump_info(ostream *out)

{
  long lVar1;
  char *__s;
  ostream *poVar2;
  int iVar3;
  long lVar4;
  string file;
  string owner;
  string state;
  string name;
  char *local_b0;
  long local_a8;
  char local_a0;
  undefined7 uStack_9f;
  char *local_90;
  long local_88;
  char local_80;
  undefined7 uStack_7f;
  char *local_70;
  long local_68;
  char local_60;
  undefined7 uStack_5f;
  long *local_50;
  long local_48;
  long local_40 [2];
  
  std::__ostream_insert<char,std::char_traits<char>>
            (out,"--------------------+-------+--------------------+------+--------------------\n",
             0x4e);
  std::__ostream_insert<char,std::char_traits<char>>
            (out," Name               | State | Owner              | Line | File\n",0x3f);
  std::__ostream_insert<char,std::char_traits<char>>
            (out,"--------------------+-------+--------------------+------+--------------------\n",
             0x4e);
  pthread_mutex_lock((pthread_mutex_t *)&MutexListMutex);
  lVar4 = 0;
  do {
    lVar1 = *(long *)((long)MutexList + lVar4);
    if (lVar1 != 0) {
      std::__cxx11::string::string
                ((string *)&local_50,*(char **)(lVar1 + 0x28),(allocator *)&local_70);
      local_68 = 0;
      local_60 = '\0';
      local_90 = &local_80;
      local_88 = 0;
      local_80 = '\0';
      local_b0 = &local_a0;
      local_a8 = 0;
      local_a0 = '\0';
      __s = *(char **)(lVar1 + 0x30);
      local_70 = &local_60;
      if (__s == (char *)0x0) {
        iVar3 = -1;
      }
      else {
        iVar3 = *(int *)(lVar1 + 0x38);
        strlen(__s);
        std::__cxx11::string::_M_replace((ulong)&local_b0,0,(char *)0x0,(ulong)__s);
      }
      *(undefined8 *)(out + *(long *)(*(long *)out + -0x18) + 0x10) = 0x14;
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>(out,(char *)local_50,local_48);
      *(undefined8 *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x10) = 0;
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"|",1);
      *(undefined8 *)(out + *(long *)(*(long *)out + -0x18) + 0x10) = 7;
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>(out,local_70,local_68);
      *(undefined8 *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x10) = 0;
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"|",1);
      *(undefined8 *)(out + *(long *)(*(long *)out + -0x18) + 0x10) = 0x14;
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>(out,local_90,local_88);
      *(undefined8 *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x10) = 0;
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"|",1);
      *(undefined8 *)(out + *(long *)(*(long *)out + -0x18) + 0x10) = 6;
      poVar2 = (ostream *)std::ostream::operator<<(out,iVar3);
      *(undefined8 *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x10) = 0;
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"|",1);
      *(undefined8 *)(out + *(long *)(*(long *)out + -0x18) + 0x10) = 0;
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>(out,local_b0,local_a8);
      *(undefined8 *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x10) = 0;
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
      if (local_b0 != &local_a0) {
        operator_delete(local_b0,CONCAT71(uStack_9f,local_a0) + 1);
      }
      if (local_90 != &local_80) {
        operator_delete(local_90,CONCAT71(uStack_7f,local_80) + 1);
      }
      if (local_70 != &local_60) {
        operator_delete(local_70,CONCAT71(uStack_5f,local_60) + 1);
      }
      if (local_50 != local_40) {
        operator_delete(local_50,local_40[0] + 1);
      }
    }
    lVar4 = lVar4 + 8;
  } while (lVar4 != 0x80);
  pthread_mutex_unlock((pthread_mutex_t *)&MutexListMutex);
  return;
}

Assistant:

void osMutex::dump_info(std::ostream& out)
{
    out << "--------------------+-------+--------------------+------+--------------------\n";
    out << " Name               | State | Owner              | Line | File\n";
    out << "--------------------+-------+--------------------+------+--------------------\n";

    LockListMutex();
    for (int i = 0; i < MAX_MUTEX; i++)
    {
        osMutex* mutex = MutexList[i];
        if (mutex != nullptr)
        {
            std::string name = mutex->Name;
            std::string state;
            std::string owner;
            int line = -1;
            std::string file;
            if (mutex->OwnerFile)
            {
                line = mutex->OwnerLine;
                file = mutex->OwnerFile;
            }
            out << std::setw(20) << name << std::setw(0) << "|";
            out << std::setw(7) << state << std::setw(0) << "|";
            out << std::setw(20) << owner << std::setw(0) << "|";
            out << std::setw(6) << line << std::setw(0) << "|";
            out << std::setw(0) << file << std::setw(0) << "\n";
        }
    }
    UnlockListMutex();
}